

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# triangle_fekete_rule.cpp
# Opt level: O1

void reference_to_physical_t3(double *t,int n,double *ref,double *phy)

{
  double dVar1;
  ulong uVar2;
  long lVar3;
  bool bVar4;
  
  uVar2 = 0;
  do {
    if (0 < n) {
      lVar3 = 0;
      do {
        dVar1 = *(double *)((long)ref + lVar3 + 8);
        *(double *)((long)phy + lVar3) =
             dVar1 * t[uVar2 | 4] +
             ((1.0 - *(double *)((long)ref + lVar3)) - dVar1) * t[uVar2] +
             *(double *)((long)ref + lVar3) * t[uVar2 | 2];
        lVar3 = lVar3 + 0x10;
      } while ((ulong)(uint)n << 4 != lVar3);
    }
    phy = phy + 1;
    bVar4 = uVar2 == 0;
    uVar2 = uVar2 + 1;
  } while (bVar4);
  return;
}

Assistant:

void reference_to_physical_t3 ( double t[], int n, double ref[], double phy[] )

//****************************************************************************80
//
//  Purpose:
//
//    REFERENCE_TO_PHYSICAL_T3 maps T3 reference points to physical points.
//
//  Discussion:
//
//    Given the vertices of an order 3 physical triangle and a point
//    (XSI,ETA) in the reference triangle, the routine computes the value
//    of the corresponding image point (X,Y) in physical space.
//
//    Note that this routine may also be appropriate for an order 6
//    triangle, if the mapping between reference and physical space
//    is linear.  This implies, in particular, that the sides of the
//    image triangle are straight and that the "midside" nodes in the
//    physical triangle are literally halfway along the sides of
//    the physical triangle.
//
//  Reference Element T3:
//
//    |           |
//    1  3        |
//    |  |\       |
//    |  | \      |
//    S  |  \     |
//    |  |   \    |
//    |  |    \   |
//    0  1-----2  |
//    |           |
//    +--0--R--1-->
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    24 June 2005
//
//  Author:
//
//    John Burkardt
//
//  Parameters:
//
//    Input, double T[2*3], the coordinates of the vertices.
//    The vertices are assumed to be the images of (0,0), (1,0) and
//    (0,1) respectively.
//
//    Input, int N, the number of objects to transform.
//
//    Input, double REF[2*N], points in the reference triangle.
//
//    Output, double PHY[2*N], corresponding points in the
//    physical triangle.
//
{
  int i;
  int j;

  for ( i = 0; i < 2; i++ )
  {
    for ( j = 0; j < n; j++ )
    {
      phy[i+j*2] = t[i+0*2] * ( 1.0 - ref[0+j*2] - ref[1+j*2] ) 
                 + t[i+1*2] *       + ref[0+j*2]                
                 + t[i+2*2] *                    + ref[1+j*2];
    }
  }

  return;
}